

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

int mraa_uart_write(mraa_uart_context dev,char *buf,size_t len)

{
  ssize_t sVar1;
  size_t len_local;
  char *buf_local;
  mraa_uart_context dev_local;
  
  if (dev == (mraa_uart_context)0x0) {
    syslog(3,"uart: write: context is NULL");
    dev_local._4_4_ = 5;
  }
  else if (((dev == (mraa_uart_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
          (dev->advance_func->uart_write_replace ==
           (_func_int_mraa_uart_context_char_ptr_size_t *)0x0)) {
    if (dev->fd < 0) {
      syslog(3,"uart%i: write: port is not open",(ulong)(uint)dev->index);
      dev_local._4_4_ = 7;
    }
    else {
      sVar1 = write(dev->fd,buf,len);
      dev_local._4_4_ = (int)sVar1;
    }
  }
  else {
    dev_local._4_4_ = (*dev->advance_func->uart_write_replace)(dev,buf,len);
  }
  return dev_local._4_4_;
}

Assistant:

int
mraa_uart_write(mraa_uart_context dev, const char* buf, size_t len)
{
    if (!dev) {
        syslog(LOG_ERR, "uart: write: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, uart_write_replace)) {
        return dev->advance_func->uart_write_replace(dev, buf, len);
    }

    if (dev->fd < 0) {
        syslog(LOG_ERR, "uart%i: write: port is not open", dev->index);
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    return write(dev->fd, buf, len);
}